

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNOT.cpp
# Opt level: O1

void test_qclab_qgates_CNOT<std::complex<float>>(void)

{
  long lVar1;
  float *pfVar2;
  void *pvVar3;
  long lVar4;
  _Alloc_hider *p_Var5;
  char cVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  float *pfVar10;
  bool bVar11;
  pointer *__ptr_16;
  long lVar12;
  char *pcVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  float *pfVar15;
  long lVar16;
  pointer *__ptr_1;
  pointer *__ptr;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  AssertionResult gtest_ar_;
  vector<int,_std::allocator<int>_> qubits;
  AssertionResult gtest_ar__5;
  CNOT<std::complex<float>_> cnot2;
  CNOT<std::complex<float>_> cnot;
  stringstream qasm;
  PauliX<std::complex<float>_> X;
  undefined1 local_250 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  AssertHelper local_230;
  undefined1 local_228 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  pointer local_218;
  Message local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  AssertHelper local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  long *local_1f0;
  CX<std::complex<float>_> local_1e8;
  AssertHelper local_1d0;
  undefined1 local_1c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [7];
  ios_base local_148 [264];
  AssertHelper local_40;
  undefined4 local_38;
  
  local_1e8.super_QControlledGate2<std::complex<float>_>.control_ = 0;
  local_1e8.super_QControlledGate2<std::complex<float>_>.controlState_ = 1;
  local_1e8.super_QControlledGate2<std::complex<float>_>.super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject =
       (QObject<std::complex<float>_>)&PTR_nbQubits_0051fab0;
  local_1e8.gate_._M_t.
  super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl =
       (__uniq_ptr_data<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>,_true,_true>
        )operator_new(0x10);
  (((PauliX<std::complex<float>_> *)
   local_1e8.gate_._M_t.
   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)->
  super_QGate1<std::complex<float>_>).qubit_ = 1;
  (((PauliX<std::complex<float>_> *)
   local_1e8.gate_._M_t.
   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)->
  super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0051f5a8;
  local_250._0_4_ = 2;
  local_228._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"cnot.nbQubits()","2",(int *)local_250,(int *)local_228);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0xd,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.control_;
  local_228._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"cnot.control()","0",(int *)local_250,(int *)local_228);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x10,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  iVar7 = (*(((QGate1<std::complex<float>_> *)
             local_1e8.gate_._M_t.
             super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
             .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
             _M_head_impl)->super_QObject<std::complex<float>_>)._vptr_QObject[3])();
  local_250._0_4_ = iVar7;
  local_228._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"cnot.target()","1",(int *)local_250,(int *)local_228);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x11,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.controlState_;
  local_228._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"cnot.controlState()","1",(int *)local_250,(int *)local_228);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x12,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  pfVar9 = (float *)operator_new__(0x80);
  pfVar9[0] = 0.0;
  pfVar9[1] = 0.0;
  pfVar9[2] = 0.0;
  pfVar9[3] = 0.0;
  pfVar9[4] = 0.0;
  pfVar9[5] = 0.0;
  pfVar9[6] = 0.0;
  pfVar9[7] = 0.0;
  pfVar9[8] = 0.0;
  pfVar9[9] = 0.0;
  pfVar9[10] = 0.0;
  pfVar9[0xb] = 0.0;
  pfVar9[0x14] = 0.0;
  pfVar9[0x15] = 0.0;
  pfVar9[0x16] = 0.0;
  pfVar9[0x17] = 0.0;
  pfVar9[0x18] = 0.0;
  pfVar9[0x19] = 0.0;
  pfVar9[0x1a] = 0.0;
  pfVar9[0x1b] = 0.0;
  pfVar9[0x10] = 0.0;
  pfVar9[0x11] = 0.0;
  pfVar9[0x12] = 0.0;
  pfVar9[0x13] = 0.0;
  pfVar9[0xc] = 0.0;
  pfVar9[0xd] = 0.0;
  pfVar9[0xe] = 0.0;
  pfVar9[0xf] = 0.0;
  pfVar9[0] = 1.0;
  pfVar9[1] = 0.0;
  pfVar9[2] = 0.0;
  pfVar9[3] = 0.0;
  pfVar9[4] = 0.0;
  pfVar9[5] = 0.0;
  pfVar9[6] = 0.0;
  pfVar9[7] = 0.0;
  pfVar9[8] = 0.0;
  pfVar9[9] = 0.0;
  pfVar9[10] = 1.0;
  pfVar9[0xb] = 0.0;
  pfVar9[0x14] = 0.0;
  pfVar9[0x15] = 0.0;
  pfVar9[0x16] = 1.0;
  pfVar9[0x17] = 0.0;
  pfVar9[0x18] = 0.0;
  pfVar9[0x19] = 0.0;
  pfVar9[0x1a] = 0.0;
  pfVar9[0x1b] = 0.0;
  auVar17._0_12_ = ZEXT812(0x3f800000);
  auVar17._12_4_ = 0;
  *(undefined1 (*) [16])(pfVar9 + 0x1c) = auVar17;
  qclab::qgates::QControlledGate2<std::complex<float>_>::matrix
            ((QControlledGate2<std::complex<float>_> *)local_1c8);
  if (CONCAT71(local_1c8._1_7_,local_1c8[0]) == 4) {
    bVar11 = false;
    if ((*pfVar9 == *(float *)&(local_1c0->_M_dataplus)._M_p) &&
       (!NAN(*pfVar9) && !NAN(*(float *)&(local_1c0->_M_dataplus)._M_p))) {
      pfVar10 = (float *)((long)&(local_1c0->_M_dataplus)._M_p + 4);
      if ((pfVar9[1] == *pfVar10) && (!NAN(pfVar9[1]) && !NAN(*pfVar10))) {
        lVar12 = 0;
        bVar11 = false;
        in_R9 = local_1c0;
        pfVar10 = pfVar9;
        do {
          lVar16 = 0;
          while( true ) {
            if (lVar16 == 3) goto LAB_00355fac;
            lVar1 = lVar16 + 1;
            if ((pfVar10[lVar16 * 2 + 2] != *(float *)(&in_R9->_M_string_length + lVar16)) ||
               (NAN(pfVar10[lVar16 * 2 + 2]) || NAN(*(float *)(&in_R9->_M_string_length + lVar16))))
            break;
            lVar4 = lVar16 * 2;
            pfVar15 = (float *)((long)&in_R9->_M_string_length + lVar16 * 8 + 4);
            if ((pfVar10[lVar4 + 3] != *pfVar15) ||
               (lVar16 = lVar1, NAN(pfVar10[lVar4 + 3]) || NAN(*pfVar15))) break;
          }
          if (lVar1 < 4) break;
LAB_00355fac:
          lVar12 = lVar12 + 1;
          bVar11 = 3 < lVar12;
          if (lVar12 == 4) break;
          if ((pfVar9[lVar12 * 8] != *(float *)&local_1c0[lVar12]._M_dataplus._M_p) ||
             (NAN(pfVar9[lVar12 * 8]) || NAN(*(float *)&local_1c0[lVar12]._M_dataplus._M_p))) break;
          pfVar10 = pfVar10 + 8;
          in_R9 = in_R9 + 1;
          pfVar15 = (float *)((long)&local_1c0[lVar12]._M_dataplus._M_p + 4);
          if ((pfVar9[lVar12 * 8 + 1] != *pfVar15) || (NAN(pfVar9[lVar12 * 8 + 1]) || NAN(*pfVar15))
             ) break;
        } while( true );
      }
    }
  }
  else {
    bVar11 = false;
  }
  local_250[0] = (internal)bVar11;
  local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_1c0);
  }
  if (local_250[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c8,(internal *)local_250,
               (AssertionResult *)"cnot.matrix() == CNOT_check","false","true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x19,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
    testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != local_1b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                      local_1b8[0]._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
    }
  }
  if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_248,local_248);
  }
  iVar8 = (**(code **)(*(long *)local_1e8.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>
                                ._M_head_impl + 0x18))();
  iVar7 = local_1e8.super_QControlledGate2<std::complex<float>_>.control_;
  if (iVar8 < local_1e8.super_QControlledGate2<std::complex<float>_>.control_) {
    iVar7 = iVar8;
  }
  local_250._0_4_ = iVar7;
  local_228._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"cnot.qubit()","0",(int *)local_250,(int *)local_228);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x1c,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  qclab::qgates::QControlledGate2<std::complex<float>_>::qubits
            ((vector<int,_std::allocator<int>_> *)local_228,
             &local_1e8.super_QControlledGate2<std::complex<float>_>);
  local_250 = (undefined1  [8])((long)local_220 - CONCAT44(local_228._4_4_,local_228._0_4_) >> 2);
  local_200.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1c8,"qubits.size()","2",(unsigned_long *)local_250,(int *)&local_200)
  ;
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x20,pcVar13);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_250 = (undefined1  [8])((ulong)local_250 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"qubits[0]","0",(int *)CONCAT44(local_228._4_4_,local_228._0_4_),
             (int *)local_250);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x21,pcVar13);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_250._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"qubits[1]","1",
             (int *)(CONCAT44(local_228._4_4_,local_228._0_4_) + 4),(int *)local_250);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x22,pcVar13);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_250 + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_1e8.super_QControlledGate2<std::complex<float>_>.control_ = 5;
  (**(_func_int **)
     ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
            super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject +
     0x88))(&local_1e8,3);
  qclab::qgates::QControlledGate2<std::complex<float>_>::qubits
            ((vector<int,_std::allocator<int>_> *)local_1c8,
             &local_1e8.super_QControlledGate2<std::complex<float>_>);
  local_200.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_250,"cnot.qubits()[0]","3",
             (int *)CONCAT71(local_1c8._1_7_,local_1c8[0]),(int *)&local_200);
  pvVar3 = (void *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_1b8[0]._M_allocated_capacity - (long)pvVar3);
  }
  if (local_250[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (local_248->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x25,pcVar13);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
  }
  if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_248,local_248);
  }
  qclab::qgates::QControlledGate2<std::complex<float>_>::qubits
            ((vector<int,_std::allocator<int>_> *)local_1c8,
             &local_1e8.super_QControlledGate2<std::complex<float>_>);
  local_200.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_250,"cnot.qubits()[1]","5",
             (int *)(CONCAT71(local_1c8._1_7_,local_1c8[0]) + 4),(int *)&local_200);
  pvVar3 = (void *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_1b8[0]._M_allocated_capacity - (long)pvVar3);
  }
  if (local_250[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (local_248->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x26,pcVar13);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
  }
  if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_248,local_248);
  }
  local_1e8.super_QControlledGate2<std::complex<float>_>._8_8_ =
       local_1e8.super_QControlledGate2<std::complex<float>_>._8_8_ & 0xffffffff00000000;
  (**(_func_int **)
     ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
            super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject +
     0x88))(&local_1e8,1);
  qclab::qgates::QGate2<std::complex<float>_>::print((QGate2<std::complex<float>_> *)&local_1e8);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
  iVar7 = qclab::qgates::CX<std::complex<float>_>::toQASM
                    (&local_1e8,(ostream *)local_1b8[0]._M_local_buf,0);
  local_200.data_._0_4_ = iVar7;
  local_40.data_ = (AssertHelperData *)((ulong)local_40.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_250,"cnot.toQASM( qasm )","0",(int *)&local_200,(int *)&local_40);
  if (local_250[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_200);
    if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (local_248->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x30,pcVar13);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_200.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_200.data_ + 8))();
    }
  }
  if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_248,local_248);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
            ((internal *)&local_200,"qasm.str()","\"cx q[0], q[1];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
             (char (*) [16])"cx q[0], q[1];\n");
  if (local_250 != (undefined1  [8])&local_240) {
    operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
  }
  if (local_200.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_250);
    if (local_1f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (local_1f8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x31,pcVar13);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_250 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_250 + 8))();
    }
  }
  if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,local_1f8);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_250,(long)local_248);
  if (local_250 != (undefined1  [8])&local_240) {
    operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
  }
  local_38 = 0;
  local_40.data_ = (AssertHelperData *)&PTR_nbQubits_0051f5a8;
  cVar6 = (**(code **)(*(long *)local_1e8.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>
                                ._M_head_impl + 0x70))();
  local_200.data_._0_1_ = (internal)cVar6;
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar6 == '\0') {
    testing::Message::Message(&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_250,(internal *)&local_200,(AssertionResult *)"*cnot.gate() == X",
               "false","true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x36,(char *)local_250);
    testing::internal::AssertHelper::operator=(&local_230,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_250 != (undefined1  [8])&local_240) {
      operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_210.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,local_1f8);
  }
  (**(code **)(*(long *)local_1e8.gate_._M_t.
                        super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                        .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>
                        ._M_head_impl + 0x38))(local_250);
  pfVar10 = (float *)operator_new__(0x20);
  pfVar10[0] = 0.0;
  pfVar10[1] = 0.0;
  pfVar10[2] = 0.0;
  pfVar10[3] = 0.0;
  *(long *)(pfVar10 + 2) = SUB168(ZEXT416(0x3f800000),0);
  *(long *)(pfVar10 + 4) = SUB168(ZEXT416(0x3f800000),0);
  pfVar10[6] = 0.0;
  pfVar10[7] = 0.0;
  if (local_250 == (undefined1  [8])0x2) {
    bVar11 = false;
    if ((*pfVar10 == *(float *)&(local_248->_M_dataplus)._M_p) &&
       (!NAN(*pfVar10) && !NAN(*(float *)&(local_248->_M_dataplus)._M_p))) {
      pfVar15 = (float *)((long)&(local_248->_M_dataplus)._M_p + 4);
      if ((pfVar10[1] == *pfVar15) && (!NAN(pfVar10[1]) && !NAN(*pfVar15))) {
        in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        bVar11 = false;
        pbVar14 = local_248;
        pfVar15 = pfVar10;
        do {
          lVar12 = 0;
          while( true ) {
            if (lVar12 == 1) goto LAB_00356981;
            lVar16 = lVar12 + 1;
            if ((pfVar15[lVar12 * 2 + 2] != *(float *)(&pbVar14->_M_string_length + lVar12)) ||
               (NAN(pfVar15[lVar12 * 2 + 2]) || NAN(*(float *)(&pbVar14->_M_string_length + lVar12))
               )) break;
            lVar1 = lVar12 * 2;
            pfVar2 = (float *)((long)&pbVar14->_M_string_length + lVar12 * 8 + 4);
            if ((pfVar15[lVar1 + 3] != *pfVar2) ||
               (lVar12 = lVar16, NAN(pfVar15[lVar1 + 3]) || NAN(*pfVar2))) break;
          }
          if (lVar16 < 2) break;
LAB_00356981:
          p_Var5 = &in_R9->_M_dataplus;
          in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&p_Var5->_M_p + 1);
          bVar11 = 1 < (long)in_R9;
          if (in_R9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2)
          break;
          if ((pfVar10[(long)in_R9 * 4] != *(float *)(&local_248->field_2 + (long)p_Var5)) ||
             (NAN(pfVar10[(long)in_R9 * 4]) || NAN(*(float *)(&local_248->field_2 + (long)p_Var5))))
          break;
          pfVar15 = pfVar15 + 4;
          pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pbVar14->field_2;
          pfVar2 = (float *)((long)&local_248->field_2 + (long)p_Var5 * 0x10 + 4);
          if ((pfVar10[(long)in_R9 * 4 + 1] != *pfVar2) ||
             (NAN(pfVar10[(long)in_R9 * 4 + 1]) || NAN(*pfVar2))) break;
        } while( true );
      }
    }
  }
  else {
    bVar11 = false;
  }
  local_200.data_._0_1_ = (internal)bVar11;
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  operator_delete__(pfVar10);
  if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_248);
  }
  if (local_200.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_250,(internal *)&local_200,
               (AssertionResult *)"cnot.gate()->matrix() == X.matrix()","false","true",(char *)in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x37,(char *)local_250);
    testing::internal::AssertHelper::operator=(&local_230,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_250 != (undefined1  [8])&local_240) {
      operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_210.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,local_1f8);
  }
  iVar7 = (**(_func_int **)
             ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                    super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                    _vptr_QObject + 0x70))(&local_1e8,&local_40);
  local_200.data_ = (AssertHelperData *)(CONCAT71(local_200.data_._1_7_,(char)iVar7) ^ 1);
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar7 != '\0') {
    testing::Message::Message(&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_250,(internal *)&local_200,(AssertionResult *)"cnot != X","false",
               "true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3a,(char *)local_250);
    testing::internal::AssertHelper::operator=(&local_230,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_250 != (undefined1  [8])&local_240) {
      operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_210.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,local_1f8);
  }
  iVar7 = (**(_func_int **)
             ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                    super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                    _vptr_QObject + 0x70))(&local_1e8,&local_40);
  local_200.data_ = (AssertHelperData *)(CONCAT71(local_200.data_._1_7_,(char)iVar7) ^ 1);
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar7 != '\0') {
    testing::Message::Message(&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_250,(internal *)&local_200,(AssertionResult *)"cnot == X","true",
               "false",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3b,(char *)local_250);
    testing::internal::AssertHelper::operator=(&local_230,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_250 != (undefined1  [8])&local_240) {
      operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_210.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,local_1f8);
  }
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000000;
  local_200.data_ = (AssertHelperData *)&PTR_nbQubits_0051fab0;
  local_1f0 = (long *)operator_new(0x10);
  *(undefined4 *)(local_1f0 + 1) = 1;
  *local_1f0 = (long)&PTR_nbQubits_0051f5a8;
  iVar7 = (**(_func_int **)
             ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                    super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                    _vptr_QObject + 0x70))();
  local_210.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_210.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,(char)iVar7);
  local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar7 == '\0') {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot == cnot2","false"
               ,"true",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3d,(char *)local_250);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_250 != (undefined1  [8])&local_240) {
      operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
    }
  }
  if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,local_208);
  }
  iVar7 = (**(_func_int **)
             ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                    super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                    _vptr_QObject + 0x70))(&local_1e8,&local_200);
  local_210.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_210.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,(char)iVar7);
  local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar7 == '\0') {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot != cnot2","true",
               "false",(char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x3e,(char *)local_250);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_250 != (undefined1  [8])&local_240) {
      operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
    }
  }
  if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,local_208);
  }
  iVar7 = (**(_func_int **)
             ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                    super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                    _vptr_QObject + 0x78))();
  if (iVar7 == 3) {
LAB_0035a7f3:
    __assert_fail("control != target()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QControlledGate2.hpp"
                  ,0x85,
                  "void qclab::qgates::QControlledGate2<std::complex<float>>::setControl(const int) [T = std::complex<float>]"
                 );
  }
  local_1e8.super_QControlledGate2<std::complex<float>_>.control_ = 3;
  local_210.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 3;
  local_230.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_250,"cnot.control()","3",(int *)&local_210,(int *)&local_230);
  if (local_250[0] == (internal)0x0) {
    testing::Message::Message(&local_210);
    if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = (local_248->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
               ,0x42,pcVar13);
    testing::internal::AssertHelper::operator=(&local_230,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if ((long *)CONCAT44(local_210.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_248,local_248);
  }
  if (local_1e8.super_QControlledGate2<std::complex<float>_>.control_ != 5) {
    (*(((QGate1<std::complex<float>_> *)
       local_1e8.gate_._M_t.
       super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
       .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)->
      super_QObject<std::complex<float>_>)._vptr_QObject[4])
              (local_1e8.gate_._M_t.
               super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
               .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
               _M_head_impl,5);
    local_210.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         (**(code **)(*(long *)local_1e8.gate_._M_t.
                               super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                               .
                               super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>
                               ._M_head_impl + 0x18))();
    local_230.data_._0_4_ = 5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_250,"cnot.target()","5",(int *)&local_210,(int *)&local_230);
    if (local_250[0] == (internal)0x0) {
      testing::Message::Message(&local_210);
      if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar13 = "";
      }
      else {
        pcVar13 = (local_248->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_230,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                 ,0x44,pcVar13);
      testing::internal::AssertHelper::operator=(&local_230,&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_230);
      if ((long *)CONCAT44(local_210.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (uint)local_210.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (uint)local_210.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl) + 8))();
      }
    }
    if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_248,local_248);
    }
    iVar7 = (**(_func_int **)
               ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                      super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                      _vptr_QObject + 0x70))(&local_1e8,&local_200);
    local_210.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_210.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,(char)iVar7);
    local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((char)iVar7 == '\0') {
      testing::Message::Message((Message *)&local_230);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot == cnot2",
                 "false","true",(char *)in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                 ,0x45,(char *)local_250);
      testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
      testing::internal::AssertHelper::~AssertHelper(&local_1d0);
      if (local_250 != (undefined1  [8])&local_240) {
        operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
      }
    }
    if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_208,local_208);
    }
    iVar7 = (**(_func_int **)
               ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                      super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                      _vptr_QObject + 0x70))(&local_1e8,&local_200);
    local_210.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_210.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,(char)iVar7);
    local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((char)iVar7 == '\0') {
      testing::Message::Message((Message *)&local_230);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot != cnot2",
                 "true","false",(char *)in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                 ,0x46,(char *)local_250);
      testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
      testing::internal::AssertHelper::~AssertHelper(&local_1d0);
      if (local_250 != (undefined1  [8])&local_240) {
        operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
      }
    }
    if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_208,local_208);
    }
    iVar7 = (**(_func_int **)
               ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                      super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                      _vptr_QObject + 0x78))();
    if (iVar7 == 4) goto LAB_0035a7f3;
    local_1e8.super_QControlledGate2<std::complex<float>_>.control_ = 4;
    local_210.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 4;
    local_230.data_._0_4_ = 4;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_250,"cnot.control()","4",(int *)&local_210,(int *)&local_230);
    if (local_250[0] == (internal)0x0) {
      testing::Message::Message(&local_210);
      if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar13 = "";
      }
      else {
        pcVar13 = (local_248->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_230,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                 ,0x49,pcVar13);
      testing::internal::AssertHelper::operator=(&local_230,&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_230);
      if ((long *)CONCAT44(local_210.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (uint)local_210.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (uint)local_210.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl) + 8))();
      }
    }
    if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_248,local_248);
    }
    if (local_1e8.super_QControlledGate2<std::complex<float>_>.control_ != 1) {
      (*(((QGate1<std::complex<float>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)
        ->super_QObject<std::complex<float>_>)._vptr_QObject[4])
                (local_1e8.gate_._M_t.
                 super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                 .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
                 _M_head_impl,1);
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           (**(code **)(*(long *)local_1e8.gate_._M_t.
                                 super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                 .
                                 super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>
                                 ._M_head_impl + 0x18))();
      local_230.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_250,"cnot.target()","1",(int *)&local_210,(int *)&local_230);
      if (local_250[0] == (internal)0x0) {
        testing::Message::Message(&local_210);
        if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar13 = "";
        }
        else {
          pcVar13 = (local_248->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x4b,pcVar13);
        testing::internal::AssertHelper::operator=(&local_230,&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        if ((long *)CONCAT44(local_210.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (uint)local_210.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         (uint)local_210.ss_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl) + 8))();
        }
      }
      if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_248,local_248);
      }
      iVar7 = (**(_func_int **)
                 ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                        super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                        _vptr_QObject + 0x70))(&local_1e8,&local_200);
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_210.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,(char)iVar7) ^ 1;
      local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((char)iVar7 != '\0') {
        testing::Message::Message((Message *)&local_230);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot != cnot2",
                   "false","true",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x4c,(char *)local_250);
        testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
        }
      }
      if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_208,local_208);
      }
      iVar7 = (**(_func_int **)
                 ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                        super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                        _vptr_QObject + 0x70))(&local_1e8,&local_200);
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_210.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,(char)iVar7) ^ 1;
      local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((char)iVar7 != '\0') {
        testing::Message::Message((Message *)&local_230);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot == cnot2",
                   "true","false",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x4d,(char *)local_250);
        testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
        }
      }
      if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_208,local_208);
      }
      *(undefined8 *)CONCAT44(local_228._4_4_,local_228._0_4_) = 0x200000001;
      local_1e8.super_QControlledGate2<std::complex<float>_>.control_ = 1;
      (**(_func_int **)
         ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject
         + 0x88))(&local_1e8,(ulong)*(uint *)((long)CONCAT44(local_228._4_4_,local_228._0_4_) + 4));
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.control_;
      local_230.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_250,"cnot.control()","1",(int *)&local_210,(int *)&local_230);
      if (local_250[0] == (internal)0x0) {
        testing::Message::Message(&local_210);
        if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar13 = "";
        }
        else {
          pcVar13 = (local_248->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x52,pcVar13);
        testing::internal::AssertHelper::operator=(&local_230,&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        if ((long *)CONCAT44(local_210.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (uint)local_210.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         (uint)local_210.ss_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl) + 8))();
        }
      }
      if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_248,local_248);
      }
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           (*(((QGate1<std::complex<float>_> *)
              local_1e8.gate_._M_t.
              super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
              .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
              _M_head_impl)->super_QObject<std::complex<float>_>)._vptr_QObject[3])();
      local_230.data_._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_250,"cnot.target()","2",(int *)&local_210,(int *)&local_230);
      if (local_250[0] == (internal)0x0) {
        testing::Message::Message(&local_210);
        if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar13 = "";
        }
        else {
          pcVar13 = (local_248->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x53,pcVar13);
        testing::internal::AssertHelper::operator=(&local_230,&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        if ((long *)CONCAT44(local_210.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (uint)local_210.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         (uint)local_210.ss_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl) + 8))();
        }
      }
      if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_248,local_248);
      }
      iVar7 = (**(_func_int **)
                 ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                        super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                        _vptr_QObject + 0x70))(&local_1e8,&local_200);
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_210.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,(char)iVar7);
      local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((char)iVar7 == '\0') {
        testing::Message::Message((Message *)&local_230);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot == cnot2",
                   "false","true",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x54,(char *)local_250);
        testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
        }
      }
      if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_208,local_208);
      }
      iVar7 = (**(_func_int **)
                 ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                        super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                        _vptr_QObject + 0x70))(&local_1e8,&local_200);
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_210.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,(char)iVar7);
      local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((char)iVar7 == '\0') {
        testing::Message::Message((Message *)&local_230);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot != cnot2",
                   "true","false",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x55,(char *)local_250);
        testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
        }
      }
      if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_208,local_208);
      }
      iVar7 = (**(_func_int **)
                 ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                        super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                        _vptr_QObject + 0x78))();
      if (iVar7 == 0) goto LAB_0035a7f3;
      local_1e8.super_QControlledGate2<std::complex<float>_>._8_8_ =
           local_1e8.super_QControlledGate2<std::complex<float>_>._8_8_ & 0xffffffff00000000;
      local_210.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      local_230.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_250,"cnot.control()","0",(int *)&local_210,(int *)&local_230);
      if (local_250[0] == (internal)0x0) {
        testing::Message::Message(&local_210);
        if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar13 = "";
        }
        else {
          pcVar13 = (local_248->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                   ,0x58,pcVar13);
        testing::internal::AssertHelper::operator=(&local_230,&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        if ((long *)CONCAT44(local_210.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (uint)local_210.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         (uint)local_210.ss_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl) + 8))();
        }
      }
      if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_248,local_248);
      }
      if (local_1e8.super_QControlledGate2<std::complex<float>_>.control_ != 1) {
        (*(((QGate1<std::complex<float>_> *)
           local_1e8.gate_._M_t.
           super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
           .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl
           )->super_QObject<std::complex<float>_>)._vptr_QObject[4])
                  (local_1e8.gate_._M_t.
                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
                   _M_head_impl,1);
        local_210.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             (**(code **)(*(long *)local_1e8.gate_._M_t.
                                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                   .
                                   super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>
                                   ._M_head_impl + 0x18))();
        local_230.data_._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot.target()","1",(int *)&local_210,(int *)&local_230);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message(&local_210);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_230,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x5a,pcVar13);
          testing::internal::AssertHelper::operator=(&local_230,&local_210);
          testing::internal::AssertHelper::~AssertHelper(&local_230);
          if ((long *)CONCAT44(local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_,
                               (uint)local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._4_4_,
                                           (uint)local_210.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        local_1e8.super_QControlledGate2<std::complex<float>_>._8_8_ =
             local_1e8.super_QControlledGate2<std::complex<float>_>._8_8_ & 0xffffffff;
        local_210.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 0;
        local_230.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot.controlState()","0",(int *)&local_210,
                   (int *)&local_230);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message(&local_210);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_230,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x5c,pcVar13);
          testing::internal::AssertHelper::operator=(&local_230,&local_210);
          testing::internal::AssertHelper::~AssertHelper(&local_230);
          if ((long *)CONCAT44(local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_,
                               (uint)local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._4_4_,
                                           (uint)local_210.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        iVar7 = (**(_func_int **)
                   ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                          super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                          _vptr_QObject + 0x70))(&local_1e8,&local_200);
        local_210.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             CONCAT31(local_210.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._1_3_,(char)iVar7) ^ 1;
        local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((char)iVar7 != '\0') {
          testing::Message::Message((Message *)&local_230);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot != cnot2",
                     "false","true",(char *)in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x5d,(char *)local_250);
          testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
          testing::internal::AssertHelper::~AssertHelper(&local_1d0);
          if (local_250 != (undefined1  [8])&local_240) {
            operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
          }
        }
        if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_208,local_208);
        }
        iVar7 = (**(_func_int **)
                   ((long)local_1e8.super_QControlledGate2<std::complex<float>_>.
                          super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                          _vptr_QObject + 0x70))(&local_1e8,&local_200);
        local_210.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             CONCAT31(local_210.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._1_3_,(char)iVar7) ^ 1;
        local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((char)iVar7 != '\0') {
          testing::Message::Message((Message *)&local_230);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_250,(internal *)&local_210,(AssertionResult *)"cnot == cnot2",
                     "true","false",(char *)in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x5e,(char *)local_250);
          testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_230);
          testing::internal::AssertHelper::~AssertHelper(&local_1d0);
          if (local_250 != (undefined1  [8])&local_240) {
            operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_230.data_._4_4_,local_230.data_._0_4_) + 8))();
          }
        }
        if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_208,local_208);
        }
        local_200.data_ = (AssertHelperData *)&PTR_nbQubits_0051fab0;
        if (local_1f0 != (long *)0x0) {
          (**(code **)(*local_1f0 + 0x68))();
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
        pvVar3 = (void *)CONCAT44(local_228._4_4_,local_228._0_4_);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,(long)local_218 - (long)pvVar3);
        }
        operator_delete__(pfVar9);
        local_1e8.super_QControlledGate2<std::complex<float>_>.super_QGate2<std::complex<float>_>.
        super_QObject<std::complex<float>_>._vptr_QObject =
             (QObject<std::complex<float>_>)&PTR_nbQubits_0051fab0;
        if (local_1e8.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
             )0x0) {
          (*(((QGate1<std::complex<float>_> *)
             local_1e8.gate_._M_t.
             super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
             .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
             _M_head_impl)->super_QObject<std::complex<float>_>)._vptr_QObject[0xd])();
        }
        local_1e8.super_QControlledGate2<std::complex<float>_>.control_ = 0;
        local_1e8.super_QControlledGate2<std::complex<float>_>.controlState_ = 1;
        local_1e8.super_QControlledGate2<std::complex<float>_>.super_QGate2<std::complex<float>_>.
        super_QObject<std::complex<float>_>._vptr_QObject =
             (QObject<std::complex<float>_>)&PTR_nbQubits_0051fab0;
        local_1e8.gate_._M_t.
        super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
        .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl =
             (__uniq_ptr_data<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>,_true,_true>
              )operator_new(0x10);
        (((PauliX<std::complex<float>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<float>_>).qubit_ = 1;
        (((PauliX<std::complex<float>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
             (_func_int **)&PTR_nbQubits_0051f5a8;
        local_250._0_4_ = 2;
        local_228._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.nbQubits()","2",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,100,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.control_;
        local_228._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.control()","0",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x67,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        iVar7 = (*(((QGate1<std::complex<float>_> *)
                   local_1e8.gate_._M_t.
                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
                   _M_head_impl)->super_QObject<std::complex<float>_>)._vptr_QObject[3])();
        local_250._0_4_ = iVar7;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.target()","1",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x68,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.controlState_;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.controlState()","1",(int *)local_250,
                   (int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x69,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        pfVar9 = (float *)operator_new__(0x80);
        pfVar9[0] = 0.0;
        pfVar9[1] = 0.0;
        pfVar9[2] = 0.0;
        pfVar9[3] = 0.0;
        pfVar9[4] = 0.0;
        pfVar9[5] = 0.0;
        pfVar9[6] = 0.0;
        pfVar9[7] = 0.0;
        pfVar9[8] = 0.0;
        pfVar9[9] = 0.0;
        pfVar9[10] = 0.0;
        pfVar9[0xb] = 0.0;
        pfVar9[0x14] = 0.0;
        pfVar9[0x15] = 0.0;
        pfVar9[0x16] = 0.0;
        pfVar9[0x17] = 0.0;
        pfVar9[0x18] = 0.0;
        pfVar9[0x19] = 0.0;
        pfVar9[0x1a] = 0.0;
        pfVar9[0x1b] = 0.0;
        pfVar9[0x10] = 0.0;
        pfVar9[0x11] = 0.0;
        pfVar9[0x12] = 0.0;
        pfVar9[0x13] = 0.0;
        pfVar9[0xc] = 0.0;
        pfVar9[0xd] = 0.0;
        pfVar9[0xe] = 0.0;
        pfVar9[0xf] = 0.0;
        pfVar9[0] = 1.0;
        pfVar9[1] = 0.0;
        pfVar9[2] = 0.0;
        pfVar9[3] = 0.0;
        pfVar9[4] = 0.0;
        pfVar9[5] = 0.0;
        pfVar9[6] = 0.0;
        pfVar9[7] = 0.0;
        pfVar9[8] = 0.0;
        pfVar9[9] = 0.0;
        pfVar9[10] = 1.0;
        pfVar9[0xb] = 0.0;
        pfVar9[0x14] = 0.0;
        pfVar9[0x15] = 0.0;
        pfVar9[0x16] = 1.0;
        pfVar9[0x17] = 0.0;
        pfVar9[0x18] = 0.0;
        pfVar9[0x19] = 0.0;
        pfVar9[0x1a] = 0.0;
        pfVar9[0x1b] = 0.0;
        auVar18._0_12_ = ZEXT812(0x3f800000);
        auVar18._12_4_ = 0;
        *(undefined1 (*) [16])(pfVar9 + 0x1c) = auVar18;
        qclab::qgates::QControlledGate2<std::complex<float>_>::matrix
                  ((QControlledGate2<std::complex<float>_> *)local_1c8);
        if (CONCAT71(local_1c8._1_7_,local_1c8[0]) == 4) {
          bVar11 = false;
          if ((*pfVar9 == *(float *)&(local_1c0->_M_dataplus)._M_p) &&
             (!NAN(*pfVar9) && !NAN(*(float *)&(local_1c0->_M_dataplus)._M_p))) {
            pfVar10 = (float *)((long)&(local_1c0->_M_dataplus)._M_p + 4);
            if ((pfVar9[1] == *pfVar10) && (!NAN(pfVar9[1]) && !NAN(*pfVar10))) {
              lVar12 = 0;
              bVar11 = false;
              in_R9 = local_1c0;
              pfVar10 = pfVar9;
              do {
                lVar16 = 0;
                while( true ) {
                  if (lVar16 == 3) goto LAB_00358085;
                  lVar1 = lVar16 + 1;
                  if ((pfVar10[lVar16 * 2 + 2] != *(float *)(&in_R9->_M_string_length + lVar16)) ||
                     (NAN(pfVar10[lVar16 * 2 + 2]) ||
                      NAN(*(float *)(&in_R9->_M_string_length + lVar16)))) break;
                  lVar4 = lVar16 * 2;
                  pfVar15 = (float *)((long)&in_R9->_M_string_length + lVar16 * 8 + 4);
                  if ((pfVar10[lVar4 + 3] != *pfVar15) ||
                     (lVar16 = lVar1, NAN(pfVar10[lVar4 + 3]) || NAN(*pfVar15))) break;
                }
                if (lVar1 < 4) break;
LAB_00358085:
                lVar12 = lVar12 + 1;
                bVar11 = 3 < lVar12;
                if (lVar12 == 4) break;
                if ((pfVar9[lVar12 * 8] != *(float *)&local_1c0[lVar12]._M_dataplus._M_p) ||
                   (NAN(pfVar9[lVar12 * 8]) || NAN(*(float *)&local_1c0[lVar12]._M_dataplus._M_p)))
                break;
                pfVar10 = pfVar10 + 8;
                in_R9 = in_R9 + 1;
                pfVar15 = (float *)((long)&local_1c0[lVar12]._M_dataplus._M_p + 4);
                if ((pfVar9[lVar12 * 8 + 1] != *pfVar15) ||
                   (NAN(pfVar9[lVar12 * 8 + 1]) || NAN(*pfVar15))) break;
              } while( true );
            }
          }
        }
        else {
          bVar11 = false;
        }
        local_250[0] = (internal)bVar11;
        local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_1c0);
        }
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c8,(internal *)local_250,
                     (AssertionResult *)"cnot01.matrix() == CNOT_check","false","true",(char *)in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x70,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != local_1b8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                            local_1b8[0]._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        local_228._0_4_ =
             qclab::qgates::CX<std::complex<float>_>::toQASM
                       (&local_1e8,(ostream *)local_1b8[0]._M_local_buf,0);
        local_200.data_ = local_200.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot01.toQASM( qasm )","0",(int *)local_228,
                   (int *)&local_200);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x74,pcVar13);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringbuf::str();
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
                  ((internal *)local_228,"qasm.str()","\"cx q[0], q[1];\\n\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   (char (*) [16])"cx q[0], q[1];\n");
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if (local_228[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_220->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x75,pcVar13);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_250 + 8))();
          }
        }
        if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220,local_220);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
        operator_delete__(pfVar9);
        local_1e8.super_QControlledGate2<std::complex<float>_>.super_QGate2<std::complex<float>_>.
        super_QObject<std::complex<float>_>._vptr_QObject =
             (QObject<std::complex<float>_>)&PTR_nbQubits_0051fab0;
        if (local_1e8.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_1e8.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>
                                ._M_head_impl + 0x68))();
        }
        local_1e8.super_QControlledGate2<std::complex<float>_>.control_ = 3;
        local_1e8.super_QControlledGate2<std::complex<float>_>.controlState_ = 1;
        local_1e8.super_QControlledGate2<std::complex<float>_>.super_QGate2<std::complex<float>_>.
        super_QObject<std::complex<float>_>._vptr_QObject =
             (QObject<std::complex<float>_>)&PTR_nbQubits_0051fab0;
        local_1e8.gate_._M_t.
        super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
        .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl =
             (__uniq_ptr_data<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>,_true,_true>
              )operator_new(0x10);
        (((PauliX<std::complex<float>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<float>_>).qubit_ = 5;
        (((PauliX<std::complex<float>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
             (_func_int **)&PTR_nbQubits_0051f5a8;
        local_250._0_4_ = 2;
        local_228._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot35.nbQubits()","2",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x7b,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.control_;
        local_228._0_4_ = 3;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot35.control()","3",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x7e,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        iVar7 = (*(((QGate1<std::complex<float>_> *)
                   local_1e8.gate_._M_t.
                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
                   _M_head_impl)->super_QObject<std::complex<float>_>)._vptr_QObject[3])();
        local_250._0_4_ = iVar7;
        local_228._0_4_ = 5;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot35.target()","5",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x7f,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.controlState_;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot35.controlState()","1",(int *)local_250,
                   (int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x80,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        pfVar9 = (float *)operator_new__(0x80);
        pfVar9[0] = 0.0;
        pfVar9[1] = 0.0;
        pfVar9[2] = 0.0;
        pfVar9[3] = 0.0;
        pfVar9[4] = 0.0;
        pfVar9[5] = 0.0;
        pfVar9[6] = 0.0;
        pfVar9[7] = 0.0;
        pfVar9[8] = 0.0;
        pfVar9[9] = 0.0;
        pfVar9[10] = 0.0;
        pfVar9[0xb] = 0.0;
        pfVar9[0x14] = 0.0;
        pfVar9[0x15] = 0.0;
        pfVar9[0x16] = 0.0;
        pfVar9[0x17] = 0.0;
        pfVar9[0x18] = 0.0;
        pfVar9[0x19] = 0.0;
        pfVar9[0x1a] = 0.0;
        pfVar9[0x1b] = 0.0;
        pfVar9[0x10] = 0.0;
        pfVar9[0x11] = 0.0;
        pfVar9[0x12] = 0.0;
        pfVar9[0x13] = 0.0;
        pfVar9[0xc] = 0.0;
        pfVar9[0xd] = 0.0;
        pfVar9[0xe] = 0.0;
        pfVar9[0xf] = 0.0;
        pfVar9[0] = 1.0;
        pfVar9[1] = 0.0;
        pfVar9[2] = 0.0;
        pfVar9[3] = 0.0;
        pfVar9[4] = 0.0;
        pfVar9[5] = 0.0;
        pfVar9[6] = 0.0;
        pfVar9[7] = 0.0;
        pfVar9[8] = 0.0;
        pfVar9[9] = 0.0;
        pfVar9[10] = 1.0;
        pfVar9[0xb] = 0.0;
        pfVar9[0x14] = 0.0;
        pfVar9[0x15] = 0.0;
        pfVar9[0x16] = 1.0;
        pfVar9[0x17] = 0.0;
        pfVar9[0x18] = 0.0;
        pfVar9[0x19] = 0.0;
        pfVar9[0x1a] = 0.0;
        pfVar9[0x1b] = 0.0;
        auVar19._0_12_ = ZEXT812(0x3f800000);
        auVar19._12_4_ = 0;
        *(undefined1 (*) [16])(pfVar9 + 0x1c) = auVar19;
        qclab::qgates::QControlledGate2<std::complex<float>_>::matrix
                  ((QControlledGate2<std::complex<float>_> *)local_1c8);
        if (CONCAT71(local_1c8._1_7_,local_1c8[0]) == 4) {
          bVar11 = false;
          if ((*pfVar9 == *(float *)&(local_1c0->_M_dataplus)._M_p) &&
             (!NAN(*pfVar9) && !NAN(*(float *)&(local_1c0->_M_dataplus)._M_p))) {
            pfVar10 = (float *)((long)&(local_1c0->_M_dataplus)._M_p + 4);
            if ((pfVar9[1] == *pfVar10) && (!NAN(pfVar9[1]) && !NAN(*pfVar10))) {
              lVar12 = 0;
              bVar11 = false;
              in_R9 = local_1c0;
              pfVar10 = pfVar9;
              do {
                lVar16 = 0;
                while( true ) {
                  if (lVar16 == 3) goto LAB_003587c7;
                  lVar1 = lVar16 + 1;
                  if ((pfVar10[lVar16 * 2 + 2] != *(float *)(&in_R9->_M_string_length + lVar16)) ||
                     (NAN(pfVar10[lVar16 * 2 + 2]) ||
                      NAN(*(float *)(&in_R9->_M_string_length + lVar16)))) break;
                  lVar4 = lVar16 * 2;
                  pfVar15 = (float *)((long)&in_R9->_M_string_length + lVar16 * 8 + 4);
                  if ((pfVar10[lVar4 + 3] != *pfVar15) ||
                     (lVar16 = lVar1, NAN(pfVar10[lVar4 + 3]) || NAN(*pfVar15))) break;
                }
                if (lVar1 < 4) break;
LAB_003587c7:
                lVar12 = lVar12 + 1;
                bVar11 = 3 < lVar12;
                if (lVar12 == 4) break;
                if ((pfVar9[lVar12 * 8] != *(float *)&local_1c0[lVar12]._M_dataplus._M_p) ||
                   (NAN(pfVar9[lVar12 * 8]) || NAN(*(float *)&local_1c0[lVar12]._M_dataplus._M_p)))
                break;
                pfVar10 = pfVar10 + 8;
                in_R9 = in_R9 + 1;
                pfVar15 = (float *)((long)&local_1c0[lVar12]._M_dataplus._M_p + 4);
                if ((pfVar9[lVar12 * 8 + 1] != *pfVar15) ||
                   (NAN(pfVar9[lVar12 * 8 + 1]) || NAN(*pfVar15))) break;
              } while( true );
            }
          }
        }
        else {
          bVar11 = false;
        }
        local_250[0] = (internal)bVar11;
        local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_1c0);
        }
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c8,(internal *)local_250,
                     (AssertionResult *)"cnot35.matrix() == CNOT_check","false","true",(char *)in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x87,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != local_1b8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                            local_1b8[0]._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        local_228._0_4_ =
             qclab::qgates::CX<std::complex<float>_>::toQASM
                       (&local_1e8,(ostream *)local_1b8[0]._M_local_buf,0);
        local_200.data_ = local_200.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot35.toQASM( qasm )","0",(int *)local_228,
                   (int *)&local_200);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x8b,pcVar13);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringbuf::str();
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
                  ((internal *)local_228,"qasm.str()","\"cx q[3], q[5];\\n\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   (char (*) [16])"cx q[3], q[5];\n");
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if (local_228[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_220->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x8c,pcVar13);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_250 + 8))();
          }
        }
        if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220,local_220);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
        operator_delete__(pfVar9);
        local_1e8.super_QControlledGate2<std::complex<float>_>.super_QGate2<std::complex<float>_>.
        super_QObject<std::complex<float>_>._vptr_QObject =
             (QObject<std::complex<float>_>)&PTR_nbQubits_0051fab0;
        if (local_1e8.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_1e8.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>
                                ._M_head_impl + 0x68))();
        }
        local_1e8.super_QControlledGate2<std::complex<float>_>.control_ = 1;
        local_1e8.super_QControlledGate2<std::complex<float>_>.controlState_ = 1;
        local_1e8.super_QControlledGate2<std::complex<float>_>.super_QGate2<std::complex<float>_>.
        super_QObject<std::complex<float>_>._vptr_QObject =
             (QObject<std::complex<float>_>)&PTR_nbQubits_0051fab0;
        local_1e8.gate_._M_t.
        super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
        .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl =
             (__uniq_ptr_data<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>,_true,_true>
              )operator_new(0x10);
        (((PauliX<std::complex<float>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<float>_>).qubit_ = 0;
        (((PauliX<std::complex<float>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
             (_func_int **)&PTR_nbQubits_0051f5a8;
        local_250._0_4_ = 2;
        local_228._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.nbQubits()","2",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x92,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.control_;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.control()","1",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x95,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        iVar7 = (*(((QGate1<std::complex<float>_> *)
                   local_1e8.gate_._M_t.
                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
                   _M_head_impl)->super_QObject<std::complex<float>_>)._vptr_QObject[3])();
        local_250._0_4_ = iVar7;
        local_228._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.target()","0",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x96,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.controlState_;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.controlState()","1",(int *)local_250,
                   (int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x97,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        pfVar9 = (float *)operator_new__(0x80);
        pfVar9[0] = 0.0;
        pfVar9[1] = 0.0;
        pfVar9[2] = 0.0;
        pfVar9[3] = 0.0;
        pfVar9[4] = 0.0;
        pfVar9[5] = 0.0;
        pfVar9[6] = 0.0;
        pfVar9[7] = 0.0;
        pfVar9[8] = 0.0;
        pfVar9[9] = 0.0;
        pfVar9[10] = 0.0;
        pfVar9[0xb] = 0.0;
        pfVar9[0xc] = 0.0;
        pfVar9[0xd] = 0.0;
        pfVar9[0xe] = 0.0;
        pfVar9[0xf] = 0.0;
        pfVar9[0x10] = 0.0;
        pfVar9[0x11] = 0.0;
        pfVar9[0x12] = 0.0;
        pfVar9[0x13] = 0.0;
        pfVar9[0x14] = 0.0;
        pfVar9[0x15] = 0.0;
        pfVar9[0x16] = 0.0;
        pfVar9[0x17] = 0.0;
        pfVar9[0x18] = 0.0;
        pfVar9[0x19] = 0.0;
        pfVar9[0x1a] = 0.0;
        pfVar9[0x1b] = 0.0;
        pfVar9[0x1c] = 0.0;
        pfVar9[0x1d] = 0.0;
        pfVar9[0x1e] = 0.0;
        pfVar9[0x1f] = 0.0;
        pfVar9[0] = 1.0;
        pfVar9[1] = 0.0;
        pfVar9[2] = 0.0;
        pfVar9[3] = 0.0;
        pfVar9[4] = 0.0;
        pfVar9[5] = 0.0;
        pfVar9[6] = 0.0;
        pfVar9[7] = 0.0;
        pfVar9[8] = 0.0;
        pfVar9[9] = 0.0;
        pfVar9[10] = 0.0;
        pfVar9[0xb] = 0.0;
        pfVar9[0xc] = 0.0;
        pfVar9[0xd] = 0.0;
        pfVar9[0xe] = 1.0;
        pfVar9[0xf] = 0.0;
        pfVar9[0x10] = 0.0;
        pfVar9[0x11] = 0.0;
        pfVar9[0x12] = 0.0;
        pfVar9[0x13] = 0.0;
        pfVar9[0x14] = 1.0;
        pfVar9[0x15] = 0.0;
        pfVar9[0x16] = 0.0;
        pfVar9[0x17] = 0.0;
        pfVar9[0x18] = 0.0;
        pfVar9[0x19] = 0.0;
        pfVar9[0x1a] = 1.0;
        pfVar9[0x1b] = 0.0;
        pfVar9[0x1c] = 0.0;
        pfVar9[0x1d] = 0.0;
        pfVar9[0x1e] = 0.0;
        pfVar9[0x1f] = 0.0;
        qclab::qgates::QControlledGate2<std::complex<float>_>::matrix
                  ((QControlledGate2<std::complex<float>_> *)local_1c8);
        if (CONCAT71(local_1c8._1_7_,local_1c8[0]) == 4) {
          bVar11 = false;
          if ((*pfVar9 == *(float *)&(local_1c0->_M_dataplus)._M_p) &&
             (!NAN(*pfVar9) && !NAN(*(float *)&(local_1c0->_M_dataplus)._M_p))) {
            pfVar10 = (float *)((long)&(local_1c0->_M_dataplus)._M_p + 4);
            if ((pfVar9[1] == *pfVar10) && (!NAN(pfVar9[1]) && !NAN(*pfVar10))) {
              lVar12 = 0;
              bVar11 = false;
              in_R9 = local_1c0;
              pfVar10 = pfVar9;
              do {
                lVar16 = 0;
                while( true ) {
                  if (lVar16 == 3) goto LAB_00358f14;
                  lVar1 = lVar16 + 1;
                  if ((pfVar10[lVar16 * 2 + 2] != *(float *)(&in_R9->_M_string_length + lVar16)) ||
                     (NAN(pfVar10[lVar16 * 2 + 2]) ||
                      NAN(*(float *)(&in_R9->_M_string_length + lVar16)))) break;
                  lVar4 = lVar16 * 2;
                  pfVar15 = (float *)((long)&in_R9->_M_string_length + lVar16 * 8 + 4);
                  if ((pfVar10[lVar4 + 3] != *pfVar15) ||
                     (lVar16 = lVar1, NAN(pfVar10[lVar4 + 3]) || NAN(*pfVar15))) break;
                }
                if (lVar1 < 4) break;
LAB_00358f14:
                lVar12 = lVar12 + 1;
                bVar11 = 3 < lVar12;
                if (lVar12 == 4) break;
                if ((pfVar9[lVar12 * 8] != *(float *)&local_1c0[lVar12]._M_dataplus._M_p) ||
                   (NAN(pfVar9[lVar12 * 8]) || NAN(*(float *)&local_1c0[lVar12]._M_dataplus._M_p)))
                break;
                pfVar10 = pfVar10 + 8;
                in_R9 = in_R9 + 1;
                pfVar15 = (float *)((long)&local_1c0[lVar12]._M_dataplus._M_p + 4);
                if ((pfVar9[lVar12 * 8 + 1] != *pfVar15) ||
                   (NAN(pfVar9[lVar12 * 8 + 1]) || NAN(*pfVar15))) break;
              } while( true );
            }
          }
        }
        else {
          bVar11 = false;
        }
        local_250[0] = (internal)bVar11;
        local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_1c0);
        }
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c8,(internal *)local_250,
                     (AssertionResult *)"cnot10.matrix() == CNOT_check","false","true",(char *)in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0x9e,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != local_1b8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                            local_1b8[0]._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        local_228._0_4_ =
             qclab::qgates::CX<std::complex<float>_>::toQASM
                       (&local_1e8,(ostream *)local_1b8[0]._M_local_buf,0);
        local_200.data_ = local_200.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot10.toQASM( qasm )","0",(int *)local_228,
                   (int *)&local_200);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xa2,pcVar13);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringbuf::str();
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
                  ((internal *)local_228,"qasm.str()","\"cx q[1], q[0];\\n\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   (char (*) [16])"cx q[1], q[0];\n");
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if (local_228[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_220->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xa3,pcVar13);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_250 + 8))();
          }
        }
        if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220,local_220);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
        operator_delete__(pfVar9);
        local_1e8.super_QControlledGate2<std::complex<float>_>.super_QGate2<std::complex<float>_>.
        super_QObject<std::complex<float>_>._vptr_QObject =
             (QObject<std::complex<float>_>)&PTR_nbQubits_0051fab0;
        if (local_1e8.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_1e8.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>
                                ._M_head_impl + 0x68))();
        }
        local_1e8.super_QControlledGate2<std::complex<float>_>.control_ = 5;
        local_1e8.super_QControlledGate2<std::complex<float>_>.controlState_ = 1;
        local_1e8.super_QControlledGate2<std::complex<float>_>.super_QGate2<std::complex<float>_>.
        super_QObject<std::complex<float>_>._vptr_QObject =
             (QObject<std::complex<float>_>)&PTR_nbQubits_0051fab0;
        local_1e8.gate_._M_t.
        super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
        .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl =
             (__uniq_ptr_data<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>,_true,_true>
              )operator_new(0x10);
        (((PauliX<std::complex<float>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<float>_>).qubit_ = 3;
        (((PauliX<std::complex<float>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
             (_func_int **)&PTR_nbQubits_0051f5a8;
        local_250._0_4_ = 2;
        local_228._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot53.nbQubits()","2",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xa9,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.control_;
        local_228._0_4_ = 5;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot53.control()","5",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xac,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        iVar7 = (*(((QGate1<std::complex<float>_> *)
                   local_1e8.gate_._M_t.
                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
                   _M_head_impl)->super_QObject<std::complex<float>_>)._vptr_QObject[3])();
        local_250._0_4_ = iVar7;
        local_228._0_4_ = 3;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot53.target()","3",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xad,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.controlState_;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot53.controlState()","1",(int *)local_250,
                   (int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xae,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        pfVar9 = (float *)operator_new__(0x80);
        pfVar9[0] = 0.0;
        pfVar9[1] = 0.0;
        pfVar9[2] = 0.0;
        pfVar9[3] = 0.0;
        pfVar9[4] = 0.0;
        pfVar9[5] = 0.0;
        pfVar9[6] = 0.0;
        pfVar9[7] = 0.0;
        pfVar9[8] = 0.0;
        pfVar9[9] = 0.0;
        pfVar9[10] = 0.0;
        pfVar9[0xb] = 0.0;
        pfVar9[0xc] = 0.0;
        pfVar9[0xd] = 0.0;
        pfVar9[0xe] = 0.0;
        pfVar9[0xf] = 0.0;
        pfVar9[0x10] = 0.0;
        pfVar9[0x11] = 0.0;
        pfVar9[0x12] = 0.0;
        pfVar9[0x13] = 0.0;
        pfVar9[0x14] = 0.0;
        pfVar9[0x15] = 0.0;
        pfVar9[0x16] = 0.0;
        pfVar9[0x17] = 0.0;
        pfVar9[0x18] = 0.0;
        pfVar9[0x19] = 0.0;
        pfVar9[0x1a] = 0.0;
        pfVar9[0x1b] = 0.0;
        pfVar9[0x1c] = 0.0;
        pfVar9[0x1d] = 0.0;
        pfVar9[0x1e] = 0.0;
        pfVar9[0x1f] = 0.0;
        pfVar9[0] = 1.0;
        pfVar9[1] = 0.0;
        pfVar9[2] = 0.0;
        pfVar9[3] = 0.0;
        pfVar9[4] = 0.0;
        pfVar9[5] = 0.0;
        pfVar9[6] = 0.0;
        pfVar9[7] = 0.0;
        pfVar9[8] = 0.0;
        pfVar9[9] = 0.0;
        pfVar9[10] = 0.0;
        pfVar9[0xb] = 0.0;
        pfVar9[0xc] = 0.0;
        pfVar9[0xd] = 0.0;
        pfVar9[0xe] = 1.0;
        pfVar9[0xf] = 0.0;
        pfVar9[0x10] = 0.0;
        pfVar9[0x11] = 0.0;
        pfVar9[0x12] = 0.0;
        pfVar9[0x13] = 0.0;
        pfVar9[0x14] = 1.0;
        pfVar9[0x15] = 0.0;
        pfVar9[0x16] = 0.0;
        pfVar9[0x17] = 0.0;
        pfVar9[0x18] = 0.0;
        pfVar9[0x19] = 0.0;
        pfVar9[0x1a] = 1.0;
        pfVar9[0x1b] = 0.0;
        pfVar9[0x1c] = 0.0;
        pfVar9[0x1d] = 0.0;
        pfVar9[0x1e] = 0.0;
        pfVar9[0x1f] = 0.0;
        qclab::qgates::QControlledGate2<std::complex<float>_>::matrix
                  ((QControlledGate2<std::complex<float>_> *)local_1c8);
        if (CONCAT71(local_1c8._1_7_,local_1c8[0]) == 4) {
          bVar11 = false;
          if ((*pfVar9 == *(float *)&(local_1c0->_M_dataplus)._M_p) &&
             (!NAN(*pfVar9) && !NAN(*(float *)&(local_1c0->_M_dataplus)._M_p))) {
            pfVar10 = (float *)((long)&(local_1c0->_M_dataplus)._M_p + 4);
            if ((pfVar9[1] == *pfVar10) && (!NAN(pfVar9[1]) && !NAN(*pfVar10))) {
              lVar12 = 0;
              bVar11 = false;
              in_R9 = local_1c0;
              pfVar10 = pfVar9;
              do {
                lVar16 = 0;
                while( true ) {
                  if (lVar16 == 3) goto LAB_00359661;
                  lVar1 = lVar16 + 1;
                  if ((pfVar10[lVar16 * 2 + 2] != *(float *)(&in_R9->_M_string_length + lVar16)) ||
                     (NAN(pfVar10[lVar16 * 2 + 2]) ||
                      NAN(*(float *)(&in_R9->_M_string_length + lVar16)))) break;
                  lVar4 = lVar16 * 2;
                  pfVar15 = (float *)((long)&in_R9->_M_string_length + lVar16 * 8 + 4);
                  if ((pfVar10[lVar4 + 3] != *pfVar15) ||
                     (lVar16 = lVar1, NAN(pfVar10[lVar4 + 3]) || NAN(*pfVar15))) break;
                }
                if (lVar1 < 4) break;
LAB_00359661:
                lVar12 = lVar12 + 1;
                bVar11 = 3 < lVar12;
                if (lVar12 == 4) break;
                if ((pfVar9[lVar12 * 8] != *(float *)&local_1c0[lVar12]._M_dataplus._M_p) ||
                   (NAN(pfVar9[lVar12 * 8]) || NAN(*(float *)&local_1c0[lVar12]._M_dataplus._M_p)))
                break;
                pfVar10 = pfVar10 + 8;
                in_R9 = in_R9 + 1;
                pfVar15 = (float *)((long)&local_1c0[lVar12]._M_dataplus._M_p + 4);
                if ((pfVar9[lVar12 * 8 + 1] != *pfVar15) ||
                   (NAN(pfVar9[lVar12 * 8 + 1]) || NAN(*pfVar15))) break;
              } while( true );
            }
          }
        }
        else {
          bVar11 = false;
        }
        local_250[0] = (internal)bVar11;
        local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_1c0);
        }
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c8,(internal *)local_250,
                     (AssertionResult *)"cnot53.matrix() == CNOT_check","false","true",(char *)in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xb5,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != local_1b8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                            local_1b8[0]._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        local_228._0_4_ =
             qclab::qgates::CX<std::complex<float>_>::toQASM
                       (&local_1e8,(ostream *)local_1b8[0]._M_local_buf,0);
        local_200.data_ = local_200.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot53.toQASM( qasm )","0",(int *)local_228,
                   (int *)&local_200);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xb9,pcVar13);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringbuf::str();
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
                  ((internal *)local_228,"qasm.str()","\"cx q[5], q[3];\\n\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   (char (*) [16])"cx q[5], q[3];\n");
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if (local_228[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_220->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xba,pcVar13);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_250 + 8))();
          }
        }
        if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220,local_220);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
        operator_delete__(pfVar9);
        local_1e8.super_QControlledGate2<std::complex<float>_>.super_QGate2<std::complex<float>_>.
        super_QObject<std::complex<float>_>._vptr_QObject =
             (QObject<std::complex<float>_>)&PTR_nbQubits_0051fab0;
        if (local_1e8.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_1e8.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>
                                ._M_head_impl + 0x68))();
        }
        local_1e8.super_QControlledGate2<std::complex<float>_>.control_ = 0;
        local_1e8.super_QControlledGate2<std::complex<float>_>.controlState_ = 0;
        local_1e8.super_QControlledGate2<std::complex<float>_>.super_QGate2<std::complex<float>_>.
        super_QObject<std::complex<float>_>._vptr_QObject =
             (QObject<std::complex<float>_>)&PTR_nbQubits_0051fab0;
        local_1e8.gate_._M_t.
        super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
        .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl =
             (__uniq_ptr_data<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>,_true,_true>
              )operator_new(0x10);
        (((PauliX<std::complex<float>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<float>_>).qubit_ = 1;
        (((PauliX<std::complex<float>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
             (_func_int **)&PTR_nbQubits_0051f5a8;
        local_250._0_4_ = 2;
        local_228._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.nbQubits()","2",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xc4,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.control_;
        local_228._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.control()","0",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,199,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        iVar7 = (*(((QGate1<std::complex<float>_> *)
                   local_1e8.gate_._M_t.
                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
                   _M_head_impl)->super_QObject<std::complex<float>_>)._vptr_QObject[3])();
        local_250._0_4_ = iVar7;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.target()","1",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,200,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.controlState_;
        local_228._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot01.controlState()","0",(int *)local_250,
                   (int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xc9,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        pfVar9 = (float *)operator_new__(0x80);
        pfVar9[0] = 0.0;
        pfVar9[1] = 0.0;
        pfVar9[2] = 0.0;
        pfVar9[3] = 0.0;
        pfVar9[8] = 0.0;
        pfVar9[9] = 0.0;
        pfVar9[10] = 0.0;
        pfVar9[0xb] = 0.0;
        pfVar9[0xc] = 0.0;
        pfVar9[0xd] = 0.0;
        pfVar9[0xe] = 0.0;
        pfVar9[0xf] = 0.0;
        pfVar9[0x10] = 0.0;
        pfVar9[0x11] = 0.0;
        pfVar9[0x12] = 0.0;
        pfVar9[0x13] = 0.0;
        pfVar9[0x14] = 0.0;
        pfVar9[0x15] = 0.0;
        pfVar9[0x16] = 0.0;
        pfVar9[0x17] = 0.0;
        pfVar9[0x18] = 0.0;
        pfVar9[0x19] = 0.0;
        pfVar9[0x1a] = 0.0;
        pfVar9[0x1b] = 0.0;
        pfVar9[0x1c] = 0.0;
        pfVar9[0x1d] = 0.0;
        pfVar9[0x1e] = 0.0;
        pfVar9[0x1f] = 0.0;
        pfVar9[4] = 0.0;
        pfVar9[5] = 0.0;
        pfVar9[6] = 0.0;
        pfVar9[7] = 0.0;
        pfVar9[2] = 1.0;
        pfVar9[3] = 0.0;
        pfVar9[8] = 1.0;
        pfVar9[9] = 0.0;
        pfVar9[10] = 0.0;
        pfVar9[0xb] = 0.0;
        pfVar9[0xc] = 0.0;
        pfVar9[0xd] = 0.0;
        pfVar9[0xe] = 0.0;
        pfVar9[0xf] = 0.0;
        pfVar9[0x10] = 0.0;
        pfVar9[0x11] = 0.0;
        pfVar9[0x12] = 0.0;
        pfVar9[0x13] = 0.0;
        pfVar9[0x14] = 1.0;
        pfVar9[0x15] = 0.0;
        pfVar9[0x16] = 0.0;
        pfVar9[0x17] = 0.0;
        pfVar9[0x18] = 0.0;
        pfVar9[0x19] = 0.0;
        pfVar9[0x1a] = 0.0;
        pfVar9[0x1b] = 0.0;
        pfVar9[0x1c] = 0.0;
        pfVar9[0x1d] = 0.0;
        pfVar9[0x1e] = 1.0;
        pfVar9[0x1f] = 0.0;
        qclab::qgates::QControlledGate2<std::complex<float>_>::matrix
                  ((QControlledGate2<std::complex<float>_> *)local_1c8);
        if (CONCAT71(local_1c8._1_7_,local_1c8[0]) == 4) {
          bVar11 = false;
          if ((*pfVar9 == *(float *)&(local_1c0->_M_dataplus)._M_p) &&
             (!NAN(*pfVar9) && !NAN(*(float *)&(local_1c0->_M_dataplus)._M_p))) {
            pfVar10 = (float *)((long)&(local_1c0->_M_dataplus)._M_p + 4);
            if ((pfVar9[1] == *pfVar10) && (!NAN(pfVar9[1]) && !NAN(*pfVar10))) {
              lVar12 = 0;
              bVar11 = false;
              in_R9 = local_1c0;
              pfVar10 = pfVar9;
              do {
                lVar16 = 0;
                while( true ) {
                  if (lVar16 == 3) goto LAB_00359da4;
                  lVar1 = lVar16 + 1;
                  if ((pfVar10[lVar16 * 2 + 2] != *(float *)(&in_R9->_M_string_length + lVar16)) ||
                     (NAN(pfVar10[lVar16 * 2 + 2]) ||
                      NAN(*(float *)(&in_R9->_M_string_length + lVar16)))) break;
                  lVar4 = lVar16 * 2;
                  pfVar15 = (float *)((long)&in_R9->_M_string_length + lVar16 * 8 + 4);
                  if ((pfVar10[lVar4 + 3] != *pfVar15) ||
                     (lVar16 = lVar1, NAN(pfVar10[lVar4 + 3]) || NAN(*pfVar15))) break;
                }
                if (lVar1 < 4) break;
LAB_00359da4:
                lVar12 = lVar12 + 1;
                bVar11 = 3 < lVar12;
                if (lVar12 == 4) break;
                if ((pfVar9[lVar12 * 8] != *(float *)&local_1c0[lVar12]._M_dataplus._M_p) ||
                   (NAN(pfVar9[lVar12 * 8]) || NAN(*(float *)&local_1c0[lVar12]._M_dataplus._M_p)))
                break;
                pfVar10 = pfVar10 + 8;
                in_R9 = in_R9 + 1;
                pfVar15 = (float *)((long)&local_1c0[lVar12]._M_dataplus._M_p + 4);
                if ((pfVar9[lVar12 * 8 + 1] != *pfVar15) ||
                   (NAN(pfVar9[lVar12 * 8 + 1]) || NAN(*pfVar15))) break;
              } while( true );
            }
          }
        }
        else {
          bVar11 = false;
        }
        local_250[0] = (internal)bVar11;
        local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_1c0);
        }
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c8,(internal *)local_250,
                     (AssertionResult *)"cnot01.matrix() == CNOT_check","false","true",(char *)in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xd0,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != local_1b8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                            local_1b8[0]._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        local_228._0_4_ =
             qclab::qgates::CX<std::complex<float>_>::toQASM
                       (&local_1e8,(ostream *)local_1b8[0]._M_local_buf,0);
        local_200.data_ = local_200.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot01.toQASM( qasm )","0",(int *)local_228,
                   (int *)&local_200);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xd4,pcVar13);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringbuf::str();
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[32]>
                  ((internal *)local_228,"qasm.str()","\"x q[0];\\ncx q[0], q[1];\\nx q[0];\\n\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   (char (*) [32])"x q[0];\ncx q[0], q[1];\nx q[0];\n");
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if (local_228[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_220->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xd5,pcVar13);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_250 + 8))();
          }
        }
        if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220,local_220);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
        operator_delete__(pfVar9);
        local_1e8.super_QControlledGate2<std::complex<float>_>.super_QGate2<std::complex<float>_>.
        super_QObject<std::complex<float>_>._vptr_QObject =
             (QObject<std::complex<float>_>)&PTR_nbQubits_0051fab0;
        if (local_1e8.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_1e8.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>
                                ._M_head_impl + 0x68))();
        }
        local_1e8.super_QControlledGate2<std::complex<float>_>.control_ = 1;
        local_1e8.super_QControlledGate2<std::complex<float>_>.controlState_ = 0;
        local_1e8.super_QControlledGate2<std::complex<float>_>.super_QGate2<std::complex<float>_>.
        super_QObject<std::complex<float>_>._vptr_QObject =
             (QObject<std::complex<float>_>)&PTR_nbQubits_0051fab0;
        local_1e8.gate_._M_t.
        super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
        .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl =
             (__uniq_ptr_data<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>,_true,_true>
              )operator_new(0x10);
        (((PauliX<std::complex<float>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<float>_>).qubit_ = 0;
        (((PauliX<std::complex<float>_> *)
         local_1e8.gate_._M_t.
         super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
         .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>._M_head_impl)
        ->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
             (_func_int **)&PTR_nbQubits_0051f5a8;
        local_250._0_4_ = 2;
        local_228._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.nbQubits()","2",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xdb,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.control_;
        local_228._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.control()","1",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xde,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        iVar7 = (*(((QGate1<std::complex<float>_> *)
                   local_1e8.gate_._M_t.
                   super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                   .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
                   _M_head_impl)->super_QObject<std::complex<float>_>)._vptr_QObject[3])();
        local_250._0_4_ = iVar7;
        local_228._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.target()","0",(int *)local_250,(int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xdf,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        local_250._0_4_ = local_1e8.super_QControlledGate2<std::complex<float>_>.controlState_;
        local_228._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_1c8,"cnot10.controlState()","0",(int *)local_250,
                   (int *)local_228);
        if (local_1c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_1c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xe0,pcVar13);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_250)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_250 + 8))();
          }
        }
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0,local_1c0);
        }
        pfVar9 = (float *)operator_new__(0x80);
        pfVar9[4] = 0.0;
        pfVar9[5] = 0.0;
        pfVar9[6] = 0.0;
        pfVar9[7] = 0.0;
        pfVar9[8] = 0.0;
        pfVar9[9] = 0.0;
        pfVar9[10] = 0.0;
        pfVar9[0xb] = 0.0;
        pfVar9[0x10] = 0.0;
        pfVar9[0x11] = 0.0;
        pfVar9[0x12] = 0.0;
        pfVar9[0x13] = 0.0;
        pfVar9[0x14] = 0.0;
        pfVar9[0x15] = 0.0;
        pfVar9[0x16] = 0.0;
        pfVar9[0x17] = 0.0;
        pfVar9[0x18] = 0.0;
        pfVar9[0x19] = 0.0;
        pfVar9[0x1a] = 0.0;
        pfVar9[0x1b] = 0.0;
        pfVar9[0x1c] = 0.0;
        pfVar9[0x1d] = 0.0;
        pfVar9[0x1e] = 0.0;
        pfVar9[0x1f] = 0.0;
        pfVar9[0xc] = 0.0;
        pfVar9[0xd] = 0.0;
        pfVar9[0xe] = 0.0;
        pfVar9[0xf] = 0.0;
        pfVar9[0] = 0.0;
        pfVar9[1] = 0.0;
        pfVar9[2] = 0.0;
        pfVar9[3] = 0.0;
        pfVar9[4] = 1.0;
        pfVar9[5] = 0.0;
        pfVar9[6] = 0.0;
        pfVar9[7] = 0.0;
        pfVar9[8] = 0.0;
        pfVar9[9] = 0.0;
        pfVar9[10] = 1.0;
        pfVar9[0xb] = 0.0;
        pfVar9[0x10] = 1.0;
        pfVar9[0x11] = 0.0;
        pfVar9[0x12] = 0.0;
        pfVar9[0x13] = 0.0;
        pfVar9[0x14] = 0.0;
        pfVar9[0x15] = 0.0;
        pfVar9[0x16] = 0.0;
        pfVar9[0x17] = 0.0;
        pfVar9[0x18] = 0.0;
        pfVar9[0x19] = 0.0;
        pfVar9[0x1a] = 0.0;
        pfVar9[0x1b] = 0.0;
        pfVar9[0x1c] = 0.0;
        pfVar9[0x1d] = 0.0;
        pfVar9[0x1e] = 1.0;
        pfVar9[0x1f] = 0.0;
        qclab::qgates::QControlledGate2<std::complex<float>_>::matrix
                  ((QControlledGate2<std::complex<float>_> *)local_1c8);
        if (CONCAT71(local_1c8._1_7_,local_1c8[0]) == 4) {
          bVar11 = false;
          if ((*pfVar9 == *(float *)&(local_1c0->_M_dataplus)._M_p) &&
             (!NAN(*pfVar9) && !NAN(*(float *)&(local_1c0->_M_dataplus)._M_p))) {
            pfVar10 = (float *)((long)&(local_1c0->_M_dataplus)._M_p + 4);
            if ((pfVar9[1] == *pfVar10) && (!NAN(pfVar9[1]) && !NAN(*pfVar10))) {
              lVar12 = 0;
              bVar11 = false;
              in_R9 = local_1c0;
              pfVar10 = pfVar9;
              do {
                lVar16 = 0;
                while( true ) {
                  if (lVar16 == 3) goto LAB_0035a4df;
                  lVar1 = lVar16 + 1;
                  if ((pfVar10[lVar16 * 2 + 2] != *(float *)(&in_R9->_M_string_length + lVar16)) ||
                     (NAN(pfVar10[lVar16 * 2 + 2]) ||
                      NAN(*(float *)(&in_R9->_M_string_length + lVar16)))) break;
                  lVar4 = lVar16 * 2;
                  pfVar15 = (float *)((long)&in_R9->_M_string_length + lVar16 * 8 + 4);
                  if ((pfVar10[lVar4 + 3] != *pfVar15) ||
                     (lVar16 = lVar1, NAN(pfVar10[lVar4 + 3]) || NAN(*pfVar15))) break;
                }
                if (lVar1 < 4) break;
LAB_0035a4df:
                lVar12 = lVar12 + 1;
                bVar11 = 3 < lVar12;
                if (lVar12 == 4) break;
                if ((pfVar9[lVar12 * 8] != *(float *)&local_1c0[lVar12]._M_dataplus._M_p) ||
                   (NAN(pfVar9[lVar12 * 8]) || NAN(*(float *)&local_1c0[lVar12]._M_dataplus._M_p)))
                break;
                pfVar10 = pfVar10 + 8;
                in_R9 = in_R9 + 1;
                pfVar15 = (float *)((long)&local_1c0[lVar12]._M_dataplus._M_p + 4);
                if ((pfVar9[lVar12 * 8 + 1] != *pfVar15) ||
                   (NAN(pfVar9[lVar12 * 8 + 1]) || NAN(*pfVar15))) break;
              } while( true );
            }
          }
        }
        else {
          bVar11 = false;
        }
        local_250[0] = (internal)bVar11;
        local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_1c0);
        }
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c8,(internal *)local_250,
                     (AssertionResult *)"cnot10.matrix() == CNOT_check","false","true",(char *)in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xe7,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != local_1b8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                            local_1b8[0]._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
        local_228._0_4_ =
             qclab::qgates::CX<std::complex<float>_>::toQASM
                       (&local_1e8,(ostream *)local_1b8[0]._M_local_buf,0);
        local_200.data_ = local_200.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_250,"cnot10.toQASM( qasm )","0",(int *)local_228,
                   (int *)&local_200);
        if (local_250[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_228);
          if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_248->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xeb,pcVar13);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if ((long *)CONCAT44(local_228._4_4_,local_228._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_228._4_4_,local_228._0_4_) + 8))();
          }
        }
        if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_248,local_248);
        }
        std::__cxx11::stringbuf::str();
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[32]>
                  ((internal *)local_228,"qasm.str()","\"x q[1];\\ncx q[1], q[0];\\nx q[1];\\n\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                   (char (*) [32])"x q[1];\ncx q[1], q[0];\nx q[1];\n");
        if (local_250 != (undefined1  [8])&local_240) {
          operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
        }
        if (local_228[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_250);
          if (local_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar13 = "";
          }
          else {
            pcVar13 = (local_220->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/CNOT.cpp"
                     ,0xec,pcVar13);
          testing::internal::AssertHelper::operator=(&local_200,(Message *)local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          if (local_250 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_250 + 8))();
          }
        }
        if (local_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220,local_220);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
        std::ios_base::~ios_base(local_148);
        operator_delete__(pfVar9);
        local_1e8.super_QControlledGate2<std::complex<float>_>.super_QGate2<std::complex<float>_>.
        super_QObject<std::complex<float>_>._vptr_QObject =
             (QObject<std::complex<float>_>)&PTR_nbQubits_0051fab0;
        if (local_1e8.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_1e8.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<float>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<float>_>_*,_false>
                                ._M_head_impl + 0x68))();
        }
        return;
      }
    }
  }
  __assert_fail("this->control() != target",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CX.hpp"
                ,0x81,
                "virtual void qclab::qgates::CX<std::complex<float>>::setTarget(const int) [T = std::complex<float>]"
               );
}

Assistant:

void test_qclab_qgates_CNOT() {

  //
  // CNOTs |1> controlled
  //
  {
    qclab::qgates::CNOT< T >  cnot ;

    EXPECT_EQ( cnot.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot.controlled() ) ;      // controlled
    EXPECT_EQ( cnot.control() , 0 ) ;       // control
    EXPECT_EQ( cnot.target() , 1 ) ;        // target
    EXPECT_EQ( cnot.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ) ;
    EXPECT_TRUE( cnot.matrix() == CNOT_check ) ;

    // qubit
    EXPECT_EQ( cnot.qubit() , 0 ) ;

    // qubits
    auto qubits = cnot.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 5 , 3 } ;
    cnot.setQubits( &qnew[0] ) ;
    EXPECT_EQ( cnot.qubits()[0] , 3 ) ;
    EXPECT_EQ( cnot.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    cnot.setQubits( &qnew[0] ) ;

    // print
    cnot.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // gate
    qclab::qgates::PauliX< T >  X ;
    EXPECT_TRUE( *cnot.gate() == X ) ;
    EXPECT_TRUE( cnot.gate()->matrix() == X.matrix() ) ;

    // operators == and !=
    EXPECT_TRUE(  cnot != X ) ;
    EXPECT_FALSE( cnot == X ) ;
    qclab::qgates::CNOT< T >  cnot2 ;
    EXPECT_TRUE(  cnot == cnot2 ) ;
    EXPECT_FALSE( cnot != cnot2 ) ;

    // setControl, setTarget, setControlState
    cnot.setControl( 3 ) ;
    EXPECT_EQ( cnot.control() , 3 ) ;
    cnot.setTarget( 5 ) ;
    EXPECT_EQ( cnot.target() , 5 ) ;
    EXPECT_TRUE(  cnot == cnot2 ) ;
    EXPECT_FALSE( cnot != cnot2 ) ;

    cnot.setControl( 4 ) ;
    EXPECT_EQ( cnot.control() , 4 ) ;
    cnot.setTarget( 1 ) ;
    EXPECT_EQ( cnot.target() , 1 ) ;
    EXPECT_TRUE(  cnot != cnot2 ) ;
    EXPECT_FALSE( cnot == cnot2 ) ;

    qubits[0] = 1 ;
    qubits[1] = 2 ;
    cnot.setQubits( &qubits[0] ) ;
    EXPECT_EQ( cnot.control() , 1 ) ;
    EXPECT_EQ( cnot.target() , 2 ) ;
    EXPECT_TRUE(  cnot == cnot2 ) ;
    EXPECT_FALSE( cnot != cnot2 ) ;

    cnot.setControl( 0 ) ;
    EXPECT_EQ( cnot.control() , 0 ) ;
    cnot.setTarget( 1 ) ;
    EXPECT_EQ( cnot.target() , 1 ) ;
    cnot.setControlState( 0 ) ;
    EXPECT_EQ( cnot.controlState() , 0 ) ;
    EXPECT_TRUE(  cnot != cnot2 ) ;
    EXPECT_FALSE( cnot == cnot2 ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot01( 0 , 1 ) ;

    EXPECT_EQ( cnot01.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot01.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot01.controlled() ) ;      // controlled
    EXPECT_EQ( cnot01.control() , 0 ) ;       // control
    EXPECT_EQ( cnot01.target() , 1 ) ;        // target
    EXPECT_EQ( cnot01.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ) ;
    EXPECT_TRUE( cnot01.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot01.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[0], q[1];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot35( 3 , 5 ) ;

    EXPECT_EQ( cnot35.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot35.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot35.controlled() ) ;      // controlled
    EXPECT_EQ( cnot35.control() , 3 ) ;       // control
    EXPECT_EQ( cnot35.target() , 5 ) ;        // target
    EXPECT_EQ( cnot35.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ) ;
    EXPECT_TRUE( cnot35.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot35.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[3], q[5];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot10( 1 , 0 ) ;

    EXPECT_EQ( cnot10.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot10.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot10.controlled() ) ;      // controlled
    EXPECT_EQ( cnot10.control() , 1 ) ;       // control
    EXPECT_EQ( cnot10.target() , 0 ) ;        // target
    EXPECT_EQ( cnot10.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ) ;
    EXPECT_TRUE( cnot10.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot10.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[1], q[0];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot53( 5 , 3 ) ;

    EXPECT_EQ( cnot53.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot53.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot53.controlled() ) ;      // controlled
    EXPECT_EQ( cnot53.control() , 5 ) ;       // control
    EXPECT_EQ( cnot53.target() , 3 ) ;        // target
    EXPECT_EQ( cnot53.controlState() , 1 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ) ;
    EXPECT_TRUE( cnot53.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot53.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "cx q[5], q[3];\n" ) ;
  }


  //
  // CNOTs |0> controlled
  //
  {
    qclab::qgates::CNOT< T >  cnot01( 0 , 1 , 0 ) ;

    EXPECT_EQ( cnot01.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot01.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot01.controlled() ) ;      // controlled
    EXPECT_EQ( cnot01.control() , 0 ) ;       // control
    EXPECT_EQ( cnot01.target() , 1 ) ;        // target
    EXPECT_EQ( cnot01.controlState() , 0 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 0 , 1 , 0 , 0 ,
                                                 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( cnot01.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot01.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[0];\ncx q[0], q[1];\nx q[0];\n" ) ;
  }

  {
    qclab::qgates::CNOT< T >  cnot10( 1 , 0 , 0 ) ;

    EXPECT_EQ( cnot10.nbQubits() , 2 ) ;      // nbQubits
    EXPECT_TRUE( cnot10.fixed() ) ;           // fixed
    EXPECT_TRUE( cnot10.controlled() ) ;      // controlled
    EXPECT_EQ( cnot10.control() , 1 ) ;       // control
    EXPECT_EQ( cnot10.target() , 0 ) ;        // target
    EXPECT_EQ( cnot10.controlState() , 0 ) ;  // controlState

    // matrix
    qclab::dense::SquareMatrix< T >  CNOT_check( 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( cnot10.matrix() == CNOT_check ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( cnot10.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[1];\ncx q[1], q[0];\nx q[1];\n" ) ;
  }

}